

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

void __thiscall
burst::
subset_iterator<std::_Rb_tree_const_iterator<int>,_std::greater<void>,_std::vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>_>
::subset_iterator(subset_iterator<std::_Rb_tree_const_iterator<int>,_std::greater<void>,_std::vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>_>
                  *this,_Base_ptr first,_Base_ptr last)

{
  bool bVar1;
  size_type __n;
  allocator_type local_11;
  
  (this->m_begin)._M_node = first;
  (this->m_end)._M_node = last;
  __n = std::__distance<std::_Rb_tree_const_iterator<int>>(first,last);
  std::
  vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>::
  vector(&this->m_subset,__n,&local_11);
  this->m_subset_size = 0;
  bVar1 = std::is_sorted<std::_Rb_tree_const_iterator<int>,std::greater<void>>
                    ((this->m_begin)._M_node,(this->m_end)._M_node);
  if (bVar1) {
    increment(this);
    return;
  }
  __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x5d,
                "burst::subset_iterator<std::_Rb_tree_const_iterator<int>, std::greater<void>>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = std::_Rb_tree_const_iterator<int>, Compare = std::greater<void>, SubsetContainer = std::vector<std::_Rb_tree_const_iterator<int>>]"
               );
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }